

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

bool __thiscall rtosc::Port_Matcher::hard_match(Port_Matcher *this,int i,char *msg)

{
  int iVar1;
  char *__s2;
  size_t __n;
  reference ppcVar2;
  char *in_RDX;
  int in_ESI;
  char *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  char *pattern;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  pattern = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(in_RDI + 8),(long)in_ESI);
  __s2 = (char *)std::__cxx11::string::c_str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(in_RDI + 8),(long)in_ESI);
  __n = std::__cxx11::string::length();
  iVar1 = strncmp(in_RDX,__s2,__n);
  if (iVar1 == 0) {
    ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)(in_RDI + 0x20),
                         (long)in_ESI);
    if (*ppcVar2 == (value_type)0x0) {
      bVar3 = true;
    }
    else {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)(in_RDI + 0x20),(long)in_ESI
                );
      bVar3 = rtosc_match_args((Port_Matcher *)
                               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),pattern
                               ,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool hard_match(int i, const char *msg)
        {
            if(strncmp(msg, fixed[i].c_str(), fixed[i].length()))
                return false;
            if(arg_spec[i])
                return rtosc_match_args(arg_spec[i], msg);
            else
                return true;
        }